

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O0

void VisitExpressionTreeNodes
               (ExprBase *expression,void *context,_func_void_void_ptr_ExprBase_ptr *accept)

{
  uint uVar1;
  ExprError *pEVar2;
  ExprBase **ppEVar3;
  ExprPassthrough *pEVar4;
  ExprArray *pEVar5;
  ExprPreModify *pEVar6;
  ExprPostModify *pEVar7;
  ExprTypeCast *pEVar8;
  ExprUnaryOp *pEVar9;
  ExprBinaryOp *pEVar10;
  ExprDereference *pEVar11;
  ExprUnboxing *pEVar12;
  ExprConditional *pEVar13;
  ExprAssignment *pEVar14;
  ExprMemberAccess *pEVar15;
  ExprArrayIndex *pEVar16;
  ExprReturn *pEVar17;
  ExprYield *pEVar18;
  ExprVariableDefinition *pEVar19;
  ExprZeroInitialize *pEVar20;
  ExprArraySetup *pEVar21;
  ExprVariableDefinitions *pEVar22;
  ExprFunctionDefinition *pEVar23;
  ExprGenericFunctionPrototype *pEVar24;
  ExprFunctionAccess *pEVar25;
  ExprFunctionOverloadSet *pEVar26;
  ExprShortFunctionOverloadSet *pEVar27;
  ExprFunctionCall *pEVar28;
  ExprGenericClassPrototype *pEVar29;
  ExprClassDefinition *pEVar30;
  ExprEnumDefinition *pEVar31;
  ExprIfElse *pEVar32;
  ExprFor *pEVar33;
  ExprWhile *pEVar34;
  ExprDoWhile *pEVar35;
  ExprSwitch *pEVar36;
  ExprBreak *pEVar37;
  ExprContinue *pEVar38;
  ExprBlock *pEVar39;
  ExprSequence *pEVar40;
  ExprModule *pEVar41;
  ExprBase *local_1e8;
  ExprBase *value_10;
  ExprBase *value_9;
  ExprModule *node_38;
  uint i_1;
  ExprSequence *node_37;
  ExprBase *value_8;
  ExprBlock *node_36;
  ExprContinue *node_35;
  ExprBreak *node_34;
  ExprBase *value_7;
  ExprBase *value_6;
  ExprSwitch *node_33;
  ExprDoWhile *node_32;
  ExprWhile *node_31;
  ExprFor *node_30;
  ExprIfElse *node_29;
  ConstantData *value_5;
  ExprEnumDefinition *node_28;
  ConstantData *value_4;
  ExprBase *value_3;
  ExprClassDefinition *node_27;
  ExprBase *value_2;
  ExprGenericClassPrototype *node_26;
  ExprBase *arg_2;
  ExprFunctionCall *node_25;
  ShortFunctionHandle *arg_1;
  ExprShortFunctionOverloadSet *node_24;
  ExprFunctionOverloadSet *node_23;
  ExprFunctionAccess *node_22;
  ExprBase *expr_1;
  ExprGenericFunctionPrototype *node_21;
  ExprBase *expr;
  ExprBase *arg;
  ExprFunctionDefinition *node_20;
  ExprBase *value_1;
  ExprVariableDefinitions *node_19;
  ExprArraySetup *node_18;
  ExprZeroInitialize *node_17;
  ExprVariableDefinition *node_16;
  ExprYield *node_15;
  ExprReturn *node_14;
  ExprArrayIndex *node_13;
  ExprMemberAccess *node_12;
  ExprAssignment *node_11;
  ExprConditional *node_10;
  ExprUnboxing *node_9;
  ExprDereference *node_8;
  ExprBinaryOp *node_7;
  ExprUnaryOp *node_6;
  ExprTypeCast *node_5;
  ExprPostModify *node_4;
  ExprPreModify *node_3;
  ExprBase *value;
  ExprArray *node_2;
  ExprPassthrough *node_1;
  uint i;
  ExprError *node;
  _func_void_void_ptr_ExprBase_ptr *accept_local;
  void *context_local;
  ExprBase *expression_local;
  
  if (expression != (ExprBase *)0x0) {
    (*accept)(context,expression);
    pEVar2 = getType<ExprError>(expression);
    if (pEVar2 == (ExprError *)0x0) {
      pEVar4 = getType<ExprPassthrough>(expression);
      if (pEVar4 == (ExprPassthrough *)0x0) {
        pEVar5 = getType<ExprArray>(expression);
        if (pEVar5 == (ExprArray *)0x0) {
          pEVar6 = getType<ExprPreModify>(expression);
          if (pEVar6 == (ExprPreModify *)0x0) {
            pEVar7 = getType<ExprPostModify>(expression);
            if (pEVar7 == (ExprPostModify *)0x0) {
              pEVar8 = getType<ExprTypeCast>(expression);
              if (pEVar8 == (ExprTypeCast *)0x0) {
                pEVar9 = getType<ExprUnaryOp>(expression);
                if (pEVar9 == (ExprUnaryOp *)0x0) {
                  pEVar10 = getType<ExprBinaryOp>(expression);
                  if (pEVar10 == (ExprBinaryOp *)0x0) {
                    pEVar11 = getType<ExprDereference>(expression);
                    if (pEVar11 == (ExprDereference *)0x0) {
                      pEVar12 = getType<ExprUnboxing>(expression);
                      if (pEVar12 == (ExprUnboxing *)0x0) {
                        pEVar13 = getType<ExprConditional>(expression);
                        if (pEVar13 == (ExprConditional *)0x0) {
                          pEVar14 = getType<ExprAssignment>(expression);
                          if (pEVar14 == (ExprAssignment *)0x0) {
                            pEVar15 = getType<ExprMemberAccess>(expression);
                            if (pEVar15 == (ExprMemberAccess *)0x0) {
                              pEVar16 = getType<ExprArrayIndex>(expression);
                              if (pEVar16 == (ExprArrayIndex *)0x0) {
                                pEVar17 = getType<ExprReturn>(expression);
                                if (pEVar17 == (ExprReturn *)0x0) {
                                  pEVar18 = getType<ExprYield>(expression);
                                  if (pEVar18 == (ExprYield *)0x0) {
                                    pEVar19 = getType<ExprVariableDefinition>(expression);
                                    if (pEVar19 == (ExprVariableDefinition *)0x0) {
                                      pEVar20 = getType<ExprZeroInitialize>(expression);
                                      if (pEVar20 == (ExprZeroInitialize *)0x0) {
                                        pEVar21 = getType<ExprArraySetup>(expression);
                                        if (pEVar21 == (ExprArraySetup *)0x0) {
                                          pEVar22 = getType<ExprVariableDefinitions>(expression);
                                          if (pEVar22 == (ExprVariableDefinitions *)0x0) {
                                            pEVar23 = getType<ExprFunctionDefinition>(expression);
                                            if (pEVar23 == (ExprFunctionDefinition *)0x0) {
                                              pEVar24 = getType<ExprGenericFunctionPrototype>
                                                                  (expression);
                                              if (pEVar24 == (ExprGenericFunctionPrototype *)0x0) {
                                                pEVar25 = getType<ExprFunctionAccess>(expression);
                                                if (pEVar25 == (ExprFunctionAccess *)0x0) {
                                                  pEVar26 = getType<ExprFunctionOverloadSet>
                                                                      (expression);
                                                  if (pEVar26 == (ExprFunctionOverloadSet *)0x0) {
                                                    pEVar27 = getType<ExprShortFunctionOverloadSet>
                                                                        (expression);
                                                    if (pEVar27 ==
                                                        (ExprShortFunctionOverloadSet *)0x0) {
                                                      pEVar28 = getType<ExprFunctionCall>
                                                                          (expression);
                                                      if (pEVar28 == (ExprFunctionCall *)0x0) {
                                                        pEVar29 = getType<ExprGenericClassPrototype>
                                                                            (expression);
                                                        if (pEVar29 ==
                                                            (ExprGenericClassPrototype *)0x0) {
                                                          pEVar30 = getType<ExprClassDefinition>
                                                                              (expression);
                                                          if (pEVar30 == (ExprClassDefinition *)0x0)
                                                          {
                                                            pEVar31 = getType<ExprEnumDefinition>
                                                                                (expression);
                                                            if (pEVar31 == (ExprEnumDefinition *)0x0
                                                               ) {
                                                              pEVar32 = getType<ExprIfElse>(
                                                  expression);
                                                  if (pEVar32 == (ExprIfElse *)0x0) {
                                                    pEVar33 = getType<ExprFor>(expression);
                                                    if (pEVar33 == (ExprFor *)0x0) {
                                                      pEVar34 = getType<ExprWhile>(expression);
                                                      if (pEVar34 == (ExprWhile *)0x0) {
                                                        pEVar35 = getType<ExprDoWhile>(expression);
                                                        if (pEVar35 == (ExprDoWhile *)0x0) {
                                                          pEVar36 = getType<ExprSwitch>(expression);
                                                          if (pEVar36 == (ExprSwitch *)0x0) {
                                                            pEVar37 = getType<ExprBreak>(expression)
                                                            ;
                                                            if (pEVar37 == (ExprBreak *)0x0) {
                                                              pEVar38 = getType<ExprContinue>
                                                                                  (expression);
                                                              if (pEVar38 == (ExprContinue *)0x0) {
                                                                pEVar39 = getType<ExprBlock>(
                                                  expression);
                                                  if (pEVar39 == (ExprBlock *)0x0) {
                                                    pEVar40 = getType<ExprSequence>(expression);
                                                    if (pEVar40 == (ExprSequence *)0x0) {
                                                      pEVar41 = getType<ExprModule>(expression);
                                                      if (pEVar41 != (ExprModule *)0x0) {
                                                        for (value_10 = (pEVar41->setup).head;
                                                            value_10 != (ExprBase *)0x0;
                                                            value_10 = value_10->next) {
                                                          VisitExpressionTreeNodes
                                                                    (value_10,context,accept);
                                                        }
                                                        for (local_1e8 = (pEVar41->expressions).head
                                                            ; local_1e8 != (ExprBase *)0x0;
                                                            local_1e8 = local_1e8->next) {
                                                          VisitExpressionTreeNodes
                                                                    (local_1e8,context,accept);
                                                        }
                                                      }
                                                    }
                                                    else {
                                                      for (node_38._4_4_ = 0;
                                                          uVar1 = SmallArray<ExprBase_*,_4U>::size
                                                                            (&pEVar40->expressions),
                                                          node_38._4_4_ < uVar1;
                                                          node_38._4_4_ = node_38._4_4_ + 1) {
                                                        ppEVar3 = SmallArray<ExprBase_*,_4U>::
                                                                  operator[](&pEVar40->expressions,
                                                                             node_38._4_4_);
                                                        VisitExpressionTreeNodes
                                                                  (*ppEVar3,context,accept);
                                                      }
                                                    }
                                                  }
                                                  else {
                                                    for (node_37 = (ExprSequence *)
                                                                   (pEVar39->expressions).head;
                                                        node_37 != (ExprSequence *)0x0;
                                                        node_37 = (ExprSequence *)
                                                                  (node_37->super_ExprBase).next) {
                                                      VisitExpressionTreeNodes
                                                                (&node_37->super_ExprBase,context,
                                                                 accept);
                                                    }
                                                    VisitExpressionTreeNodes
                                                              (pEVar39->closures,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar38->closures,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar37->closures,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar36->condition,context,accept);
                                                    for (value_7 = (pEVar36->cases).head;
                                                        value_7 != (ExprBase *)0x0;
                                                        value_7 = value_7->next) {
                                                      VisitExpressionTreeNodes
                                                                (value_7,context,accept);
                                                    }
                                                    for (node_34 = (ExprBreak *)
                                                                   (pEVar36->blocks).head;
                                                        node_34 != (ExprBreak *)0x0;
                                                        node_34 = (ExprBreak *)
                                                                  (node_34->super_ExprBase).next) {
                                                      VisitExpressionTreeNodes
                                                                (&node_34->super_ExprBase,context,
                                                                 accept);
                                                    }
                                                    VisitExpressionTreeNodes
                                                              (pEVar36->defaultBlock,context,accept)
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar35->body,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar35->condition,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar34->condition,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar34->body,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar33->initializer,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar33->condition,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar33->increment,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar33->body,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar32->condition,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar32->trueBlock,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar32->falseBlock,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    for (node_29 = (ExprIfElse *)
                                                                   (pEVar31->enumType->
                                                                   super_TypeStruct).constants.head;
                                                        node_29 != (ExprIfElse *)0x0;
                                                        node_29 = (ExprIfElse *)
                                                                  (node_29->super_ExprBase).source)
                                                    {
                                                      VisitExpressionTreeNodes
                                                                (*(ExprBase **)
                                                                  &(node_29->super_ExprBase).typeID,
                                                                 context,accept);
                                                    }
                                                    VisitExpressionTreeNodes
                                                              (pEVar31->toInt,context,accept);
                                                    VisitExpressionTreeNodes
                                                              (pEVar31->toEnum,context,accept);
                                                  }
                                                  }
                                                  else {
                                                    for (value_4 = (ConstantData *)
                                                                   (pEVar30->functions).head;
                                                        value_4 != (ConstantData *)0x0;
                                                        value_4 = (ConstantData *)value_4[1].name) {
                                                      VisitExpressionTreeNodes
                                                                ((ExprBase *)value_4,context,accept)
                                                      ;
                                                    }
                                                    for (node_28 = (ExprEnumDefinition *)
                                                                   (pEVar30->classType->
                                                                   super_TypeStruct).constants.head;
                                                        node_28 != (ExprEnumDefinition *)0x0;
                                                        node_28 = (ExprEnumDefinition *)
                                                                  (node_28->super_ExprBase).source)
                                                    {
                                                      VisitExpressionTreeNodes
                                                                (*(ExprBase **)
                                                                  &(node_28->super_ExprBase).typeID,
                                                                 context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    for (node_27 = (ExprClassDefinition *)
                                                                   (pEVar29->genericProtoType->
                                                                   instances).head;
                                                        node_27 != (ExprClassDefinition *)0x0;
                                                        node_27 = (ExprClassDefinition *)
                                                                  (node_27->super_ExprBase).next) {
                                                      VisitExpressionTreeNodes
                                                                (&node_27->super_ExprBase,context,
                                                                 accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar28->function,context,accept);
                                                    for (node_26 = (ExprGenericClassPrototype *)
                                                                   (pEVar28->arguments).head;
                                                        node_26 != (ExprGenericClassPrototype *)0x0;
                                                        node_26 = (ExprGenericClassPrototype *)
                                                                  (node_26->super_ExprBase).next) {
                                                      VisitExpressionTreeNodes
                                                                (&node_26->super_ExprBase,context,
                                                                 accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    for (node_25 = (ExprFunctionCall *)
                                                                   (pEVar27->functions).head;
                                                        node_25 != (ExprFunctionCall *)0x0;
                                                        node_25 = (ExprFunctionCall *)
                                                                  (node_25->super_ExprBase).source)
                                                    {
                                                      VisitExpressionTreeNodes
                                                                (*(ExprBase **)
                                                                  &(node_25->super_ExprBase).typeID,
                                                                 context,accept);
                                                    }
                                                  }
                                                  }
                                                  else {
                                                    VisitExpressionTreeNodes
                                                              (pEVar26->context,context,accept);
                                                  }
                                                }
                                                else {
                                                  VisitExpressionTreeNodes
                                                            (pEVar25->context,context,accept);
                                                }
                                              }
                                              else {
                                                for (node_22 = (ExprFunctionAccess *)
                                                               (pEVar24->contextVariables).head;
                                                    node_22 != (ExprFunctionAccess *)0x0;
                                                    node_22 = (ExprFunctionAccess *)
                                                              (node_22->super_ExprBase).next) {
                                                  VisitExpressionTreeNodes
                                                            (&node_22->super_ExprBase,context,accept
                                                            );
                                                }
                                              }
                                            }
                                            else {
                                              VisitExpressionTreeNodes
                                                        (&pEVar23->contextArgument->super_ExprBase,
                                                         context,accept);
                                              for (expr = &((pEVar23->arguments).head)->
                                                           super_ExprBase; expr != (ExprBase *)0x0;
                                                  expr = expr->next) {
                                                VisitExpressionTreeNodes(expr,context,accept);
                                              }
                                              VisitExpressionTreeNodes
                                                        (pEVar23->coroutineStateRead,context,accept)
                                              ;
                                              for (node_21 = (ExprGenericFunctionPrototype *)
                                                             (pEVar23->expressions).head;
                                                  node_21 != (ExprGenericFunctionPrototype *)0x0;
                                                  node_21 = (ExprGenericFunctionPrototype *)
                                                            (node_21->super_ExprBase).next) {
                                                VisitExpressionTreeNodes
                                                          (&node_21->super_ExprBase,context,accept);
                                              }
                                            }
                                          }
                                          else {
                                            for (node_20 = (ExprFunctionDefinition *)
                                                           (pEVar22->definitions).head;
                                                node_20 != (ExprFunctionDefinition *)0x0;
                                                node_20 = (ExprFunctionDefinition *)
                                                          (node_20->super_ExprBase).next) {
                                              VisitExpressionTreeNodes
                                                        (&node_20->super_ExprBase,context,accept);
                                            }
                                          }
                                        }
                                        else {
                                          VisitExpressionTreeNodes(pEVar21->lhs,context,accept);
                                          VisitExpressionTreeNodes
                                                    (pEVar21->initializer,context,accept);
                                        }
                                      }
                                      else {
                                        VisitExpressionTreeNodes(pEVar20->address,context,accept);
                                      }
                                    }
                                    else {
                                      VisitExpressionTreeNodes(pEVar19->initializer,context,accept);
                                    }
                                  }
                                  else {
                                    VisitExpressionTreeNodes(pEVar18->value,context,accept);
                                    VisitExpressionTreeNodes
                                              (pEVar18->coroutineStateUpdate,context,accept);
                                    VisitExpressionTreeNodes(pEVar18->closures,context,accept);
                                  }
                                }
                                else {
                                  VisitExpressionTreeNodes(pEVar17->value,context,accept);
                                  VisitExpressionTreeNodes
                                            (pEVar17->coroutineStateUpdate,context,accept);
                                  VisitExpressionTreeNodes(pEVar17->closures,context,accept);
                                }
                              }
                              else {
                                VisitExpressionTreeNodes(pEVar16->value,context,accept);
                                VisitExpressionTreeNodes(pEVar16->index,context,accept);
                              }
                            }
                            else {
                              VisitExpressionTreeNodes(pEVar15->value,context,accept);
                            }
                          }
                          else {
                            VisitExpressionTreeNodes(pEVar14->lhs,context,accept);
                            VisitExpressionTreeNodes(pEVar14->rhs,context,accept);
                          }
                        }
                        else {
                          VisitExpressionTreeNodes(pEVar13->condition,context,accept);
                          VisitExpressionTreeNodes(pEVar13->trueBlock,context,accept);
                          VisitExpressionTreeNodes(pEVar13->falseBlock,context,accept);
                        }
                      }
                      else {
                        VisitExpressionTreeNodes(pEVar12->value,context,accept);
                      }
                    }
                    else {
                      VisitExpressionTreeNodes(pEVar11->value,context,accept);
                    }
                  }
                  else {
                    VisitExpressionTreeNodes(pEVar10->lhs,context,accept);
                    VisitExpressionTreeNodes(pEVar10->rhs,context,accept);
                  }
                }
                else {
                  VisitExpressionTreeNodes(pEVar9->value,context,accept);
                }
              }
              else {
                VisitExpressionTreeNodes(pEVar8->value,context,accept);
              }
            }
            else {
              VisitExpressionTreeNodes(pEVar7->value,context,accept);
            }
          }
          else {
            VisitExpressionTreeNodes(pEVar6->value,context,accept);
          }
        }
        else {
          for (node_3 = (ExprPreModify *)(pEVar5->values).head; node_3 != (ExprPreModify *)0x0;
              node_3 = (ExprPreModify *)(node_3->super_ExprBase).next) {
            VisitExpressionTreeNodes(&node_3->super_ExprBase,context,accept);
          }
        }
      }
      else {
        VisitExpressionTreeNodes(pEVar4->value,context,accept);
      }
    }
    else {
      for (node_1._4_4_ = 0; uVar1 = SmallArray<ExprBase_*,_4U>::size(&pEVar2->values),
          node_1._4_4_ < uVar1; node_1._4_4_ = node_1._4_4_ + 1) {
        ppEVar3 = SmallArray<ExprBase_*,_4U>::operator[](&pEVar2->values,node_1._4_4_);
        VisitExpressionTreeNodes(*ppEVar3,context,accept);
      }
    }
  }
  return;
}

Assistant:

void VisitExpressionTreeNodes(ExprBase *expression, void *context, void(*accept)(void *context, ExprBase *child))
{
	if(!expression)
		return;

	accept(context, expression);

	if(ExprError *node = getType<ExprError>(expression))
	{
		for(unsigned i = 0; i < node->values.size(); i++)
			VisitExpressionTreeNodes(node->values[i], context, accept);
	}
	else if(ExprPassthrough *node = getType<ExprPassthrough>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArray *node = getType<ExprArray>(expression))
	{
		for(ExprBase *value = node->values.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprPreModify *node = getType<ExprPreModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprPostModify *node = getType<ExprPostModify>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprTypeCast *node = getType<ExprTypeCast>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnaryOp *node = getType<ExprUnaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprBinaryOp *node = getType<ExprBinaryOp>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprDereference *node = getType<ExprDereference>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprUnboxing *node = getType<ExprUnboxing>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprConditional *node = getType<ExprConditional>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprAssignment *node = getType<ExprAssignment>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->rhs, context, accept);
	}
	else if(ExprMemberAccess *node = getType<ExprMemberAccess>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
	}
	else if(ExprArrayIndex *node = getType<ExprArrayIndex>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);
		VisitExpressionTreeNodes(node->index, context, accept);
	}
	else if(ExprReturn *node = getType<ExprReturn>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprYield *node = getType<ExprYield>(expression))
	{
		VisitExpressionTreeNodes(node->value, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateUpdate, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprVariableDefinition *node = getType<ExprVariableDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprZeroInitialize *node = getType<ExprZeroInitialize>(expression))
	{
		VisitExpressionTreeNodes(node->address, context, accept);
	}
	else if(ExprArraySetup *node = getType<ExprArraySetup>(expression))
	{
		VisitExpressionTreeNodes(node->lhs, context, accept);
		VisitExpressionTreeNodes(node->initializer, context, accept);
	}
	else if(ExprVariableDefinitions *node = getType<ExprVariableDefinitions>(expression))
	{
		for(ExprBase *value = node->definitions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprFunctionDefinition *node = getType<ExprFunctionDefinition>(expression))
	{
		VisitExpressionTreeNodes(node->contextArgument, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);

		VisitExpressionTreeNodes(node->coroutineStateRead, context, accept);

		for(ExprBase *expr = node->expressions.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprGenericFunctionPrototype *node = getType<ExprGenericFunctionPrototype>(expression))
	{
		for(ExprBase *expr = node->contextVariables.head; expr; expr = expr->next)
			VisitExpressionTreeNodes(expr, context, accept);
	}
	else if(ExprFunctionAccess *node = getType<ExprFunctionAccess>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(expression))
	{
		VisitExpressionTreeNodes(node->context, context, accept);
	}
	else if(ExprShortFunctionOverloadSet *node = getType<ExprShortFunctionOverloadSet>(expression))
	{
		for(ShortFunctionHandle *arg = node->functions.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg->context, context, accept);
	}
	else if(ExprFunctionCall *node = getType<ExprFunctionCall>(expression))
	{
		VisitExpressionTreeNodes(node->function, context, accept);

		for(ExprBase *arg = node->arguments.head; arg; arg = arg->next)
			VisitExpressionTreeNodes(arg, context, accept);
	}
	else if(ExprGenericClassPrototype *node = getType<ExprGenericClassPrototype>(expression))
	{
		for(ExprBase *value = node->genericProtoType->instances.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
	else if(ExprClassDefinition *node = getType<ExprClassDefinition>(expression))
	{
		for(ExprBase *value = node->functions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ConstantData *value = node->classType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);
	}
	else if(ExprEnumDefinition *node = getType<ExprEnumDefinition>(expression))
	{
		for(ConstantData *value = node->enumType->constants.head; value; value = value->next)
			VisitExpressionTreeNodes(value->value, context, accept);

		VisitExpressionTreeNodes(node->toInt, context, accept);
		VisitExpressionTreeNodes(node->toEnum, context, accept);
	}
	else if(ExprIfElse *node = getType<ExprIfElse>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->trueBlock, context, accept);
		VisitExpressionTreeNodes(node->falseBlock, context, accept);
	}
	else if(ExprFor *node = getType<ExprFor>(expression))
	{
		VisitExpressionTreeNodes(node->initializer, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->increment, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprWhile *node = getType<ExprWhile>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);
		VisitExpressionTreeNodes(node->body, context, accept);
	}
	else if(ExprDoWhile *node = getType<ExprDoWhile>(expression))
	{
		VisitExpressionTreeNodes(node->body, context, accept);
		VisitExpressionTreeNodes(node->condition, context, accept);
	}
	else if(ExprSwitch *node = getType<ExprSwitch>(expression))
	{
		VisitExpressionTreeNodes(node->condition, context, accept);

		for(ExprBase *value = node->cases.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->blocks.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->defaultBlock, context, accept);
	}
	else if(ExprBreak *node = getType<ExprBreak>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprContinue *node = getType<ExprContinue>(expression))
	{
		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprBlock *node = getType<ExprBlock>(expression))
	{
		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		VisitExpressionTreeNodes(node->closures, context, accept);
	}
	else if(ExprSequence *node = getType<ExprSequence>(expression))
	{
		for(unsigned i = 0; i < node->expressions.size(); i++)
			VisitExpressionTreeNodes(node->expressions[i], context, accept);
	}
	else if(ExprModule *node = getType<ExprModule>(expression))
	{
		for(ExprBase *value = node->setup.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);

		for(ExprBase *value = node->expressions.head; value; value = value->next)
			VisitExpressionTreeNodes(value, context, accept);
	}
}